

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Cond.cpp
# Opt level: O0

Vec<Hpipe::Cond::Range> * __thiscall
Hpipe::Cond::ok_ranges_opt(Vec<Hpipe::Cond::Range> *__return_storage_ptr__,Cond *this,Cond *not_in)

{
  bool bVar1;
  int iVar2;
  ulong uVar3;
  size_type sVar4;
  Range *pRVar5;
  Range *pRVar6;
  char *__filename;
  bool local_d7;
  bool local_cf;
  bool local_cd;
  bool local_cb;
  int local_b0;
  uint local_ac;
  uint i_3;
  int local_88;
  int local_84;
  int beg_1;
  int i_2;
  int p;
  int i_1;
  Range *r;
  iterator __end2;
  iterator __begin2;
  Vec<Hpipe::Cond::Range> *__range2;
  int local_38;
  int beg;
  int local_28;
  undefined1 local_21;
  int i;
  Cond *not_in_local;
  Cond *this_local;
  Vec<Hpipe::Cond::Range> *ra;
  
  local_21 = 0;
  _i = not_in;
  not_in_local = this;
  this_local = (Cond *)__return_storage_ptr__;
  Vec<Hpipe::Cond::Range>::Vec(__return_storage_ptr__);
  if (_i == (Cond *)0x0) {
    for (local_84 = 0; local_84 < 0x100; local_84 = local_84 + 1) {
      bVar1 = std::bitset<256UL>::operator[](&this->p,(long)local_84);
      if (bVar1) {
        local_88 = local_84;
        do {
          local_84 = local_84 + 1;
          local_d7 = false;
          if (local_84 < 0x100) {
            local_d7 = std::bitset<256UL>::operator[](&this->p,(long)local_84);
          }
        } while (local_d7 != false);
        Range::Range((Range *)&stack0xffffffffffffff58,local_88,local_84 + -1);
        Vec<Hpipe::Cond::Range>::operator<<
                  (__return_storage_ptr__,(Range *)&stack0xffffffffffffff58);
        Range::~Range((Range *)&stack0xffffffffffffff58);
      }
    }
  }
  else {
    for (local_28 = 0; local_28 < 0x100; local_28 = local_28 + 1) {
      bVar1 = std::bitset<256UL>::operator[](&this->p,(long)local_28);
      if ((bVar1) && (bVar1 = operator[](_i,local_28), !bVar1)) {
        local_38 = local_28;
        local_28 = local_28 + 1;
        while( true ) {
          local_cb = false;
          if (local_38 != 0) {
            local_cb = operator[](_i,local_38 + -1);
          }
          if (local_cb == false) break;
          local_38 = local_38 + -1;
        }
        while( true ) {
          local_cd = false;
          if (local_28 < 0x100) {
            bVar1 = std::bitset<256UL>::operator[](&this->p,(long)local_28);
            local_cf = true;
            if (!bVar1) {
              local_cf = operator[](_i,local_28);
            }
            local_cd = local_cf;
          }
          if (local_cd == false) break;
          local_28 = local_28 + 1;
        }
        Range::Range((Range *)&__range2,local_38,local_28 + -1);
        Vec<Hpipe::Cond::Range>::operator<<(__return_storage_ptr__,(Range *)&__range2);
        Range::~Range((Range *)&__range2);
      }
    }
    __end2 = std::vector<Hpipe::Cond::Range,_std::allocator<Hpipe::Cond::Range>_>::begin
                       (&__return_storage_ptr__->
                         super_vector<Hpipe::Cond::Range,_std::allocator<Hpipe::Cond::Range>_>);
    r = (Range *)std::vector<Hpipe::Cond::Range,_std::allocator<Hpipe::Cond::Range>_>::end
                           (&__return_storage_ptr__->
                             super_vector<Hpipe::Cond::Range,_std::allocator<Hpipe::Cond::Range>_>);
    while (bVar1 = __gnu_cxx::operator!=
                             (&__end2,(__normal_iterator<Hpipe::Cond::Range_*,_std::vector<Hpipe::Cond::Range,_std::allocator<Hpipe::Cond::Range>_>_>
                                       *)&r), bVar1) {
      _p = __gnu_cxx::
           __normal_iterator<Hpipe::Cond::Range_*,_std::vector<Hpipe::Cond::Range,_std::allocator<Hpipe::Cond::Range>_>_>
           ::operator*(&__end2);
      iVar2 = Range::size(_p);
      if (iVar2 != 1) {
        i_2 = _p->beg;
        beg_1 = -1;
        for (; i_2 != _p->end + 1; i_2 = i_2 + 1) {
          bVar1 = operator[](_i,i_2);
          if (!bVar1) {
            if (-1 < beg_1) goto LAB_001db489;
            beg_1 = i_2;
          }
        }
        _p->beg = beg_1;
        _p->end = beg_1;
      }
LAB_001db489:
      __gnu_cxx::
      __normal_iterator<Hpipe::Cond::Range_*,_std::vector<Hpipe::Cond::Range,_std::allocator<Hpipe::Cond::Range>_>_>
      ::operator++(&__end2);
    }
  }
  for (local_ac = 1; uVar3 = (ulong)local_ac,
      sVar4 = std::vector<Hpipe::Cond::Range,_std::allocator<Hpipe::Cond::Range>_>::size
                        (&__return_storage_ptr__->
                          super_vector<Hpipe::Cond::Range,_std::allocator<Hpipe::Cond::Range>_>),
      uVar3 < sVar4; local_ac = local_ac + 1) {
    pRVar5 = Vec<Hpipe::Cond::Range>::operator[](__return_storage_ptr__,local_ac - 1);
    iVar2 = Range::size(pRVar5);
    if (1 < iVar2) {
      pRVar5 = Vec<Hpipe::Cond::Range>::operator[](__return_storage_ptr__,local_ac - 1);
      iVar2 = pRVar5->end;
      pRVar5 = Vec<Hpipe::Cond::Range>::operator[](__return_storage_ptr__,local_ac);
      if (iVar2 + 2 == pRVar5->beg) {
        pRVar5 = Vec<Hpipe::Cond::Range>::operator[](__return_storage_ptr__,local_ac - 1);
        pRVar6 = Vec<Hpipe::Cond::Range>::operator[](__return_storage_ptr__,local_ac - 1);
        local_b0 = pRVar6->end + 1;
        Vec<int>::operator<<(&pRVar5->exceptions,&local_b0);
        pRVar5 = Vec<Hpipe::Cond::Range>::operator[](__return_storage_ptr__,local_ac);
        iVar2 = pRVar5->end;
        pRVar5 = Vec<Hpipe::Cond::Range>::operator[](__return_storage_ptr__,local_ac - 1);
        pRVar5->end = iVar2;
        __filename = (char *)(ulong)local_ac;
        local_ac = local_ac - 1;
        Vec<Hpipe::Cond::Range>::remove(__return_storage_ptr__,__filename);
      }
    }
  }
  return __return_storage_ptr__;
}

Assistant:

Vec<Cond::Range> Cond::ok_ranges_opt( const Cond *not_in ) const {
    Vec<Range> ra;
    if ( not_in ) {
        for( int i = 0; i < p_size; ++i ) {
            // beginning if a Range
            if ( p[ i ] and not (*not_in)[ i ] ) {
                // leftest beg
                int beg = i++;
                while ( beg and (*not_in)[ beg - 1 ] )
                    --beg;
                // rightest end
                while ( i < p_size and ( p[ i ] or (*not_in)[ i ] ) )
                    ++i;
                // register the interval
                ra << Range( beg, i - 1 );
            }
        }

        // reduction of ranges with only 1 not not_in
        for( Range &r : ra ) {
            if ( r.size() == 1 )
                continue;
            for( int i = r.beg, p = -1; ; ++i ) {
                if ( i == r.end + 1 ) {
                    r.beg = p;
                    r.end = p;
                    break;
                }
                if ( not (*not_in)[ i ] ) {
                    if ( p >= 0 )
                        break;
                    p = i;
                }
            }
        }
    } else {
        for( int i = 0; i < p_size; ++i ) {
            // beginning if a Range
            if ( p[ i ] ) {
                int beg = i++;
                while ( i < p_size and p[ i ] )
                    ++i;
                ra << Range( beg, i - 1 );
            }
        }
    }

    // [ ... x - 1 ] | [ x + 1 ... ] if cardinal first interval > 1
    for( unsigned i = 1; i < ra.size(); ++i ) {
        if ( ra[ i - 1 ].size() >= 2 and ra[ i - 1 ].end + 2 == ra[ i ].beg ) {
            ra[ i - 1 ].exceptions << ra[ i - 1 ].end + 1;
            ra[ i - 1 ].end = ra[ i ].end;
            ra.remove( i-- );
        }
    }

    return ra;
}